

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_encoder.cc
# Opt level: O3

bool __thiscall draco::PointCloudEncoder::GenerateAttributesEncoders(PointCloudEncoder *this)

{
  pointer puVar1;
  pointer piVar2;
  __uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_> _Var3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  
  uVar6 = (long)(this->point_cloud_->attributes_).
                super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->point_cloud_->attributes_).
                super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)(uVar6 >> 3)) {
    uVar8 = 0;
    do {
      iVar5 = (*this->_vptr_PointCloudEncoder[9])(this,(ulong)uVar8);
      if ((char)iVar5 == '\0') {
        return false;
      }
      uVar6 = (long)(this->point_cloud_->attributes_).
                    super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->point_cloud_->attributes_).
                    super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = uVar8 + 1;
    } while ((int)uVar8 < (int)(uVar6 >> 3));
  }
  std::vector<int,_std::allocator<int>_>::resize
            (&this->attribute_to_encoder_map_,(long)(int)(uVar6 >> 3));
  puVar1 = (this->attributes_encoders_).
           super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(this->attributes_encoders_).
                super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar7 != 0) {
    piVar2 = (this->attribute_to_encoder_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar6 = 0;
    do {
      _Var3._M_t.
      super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
      .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
           puVar1[uVar6]._M_t.
           super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
           ._M_t;
      lVar4 = *(long *)((long)_Var3._M_t.
                              super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                              .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl
                       + 8);
      iVar5 = (int)((ulong)(*(long *)((long)_Var3._M_t.
                                            super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                            .
                                            super__Head_base<0UL,_draco::AttributesEncoder_*,_false>
                                            ._M_head_impl + 0x10) - lVar4) >> 2);
      if (iVar5 != 0) {
        iVar9 = 0;
        do {
          piVar2[*(int *)(lVar4 + (long)iVar9 * 4)] = (int)uVar6;
          iVar9 = iVar9 + 1;
        } while (iVar5 != iVar9);
      }
      uVar6 = uVar6 + 1;
    } while ((uVar6 & 0xffffffff) < (ulong)(lVar7 >> 3));
  }
  return true;
}

Assistant:

bool PointCloudEncoder::GenerateAttributesEncoders() {
  for (int i = 0; i < point_cloud_->num_attributes(); ++i) {
    if (!GenerateAttributesEncoder(i)) {
      return false;
    }
  }
  attribute_to_encoder_map_.resize(point_cloud_->num_attributes());
  for (uint32_t i = 0; i < attributes_encoders_.size(); ++i) {
    for (uint32_t j = 0; j < attributes_encoders_[i]->num_attributes(); ++j) {
      attribute_to_encoder_map_[attributes_encoders_[i]->GetAttributeId(j)] = i;
    }
  }
  return true;
}